

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O2

int write_webm_file_header
              (WebmOutputContext *webm_ctx,aom_codec_ctx_t *encoder_ctx,aom_codec_enc_cfg_t *cfg,
              stereo_format_t stereo_fmt,uint fourcc,AvxRational *par,char *encoder_settings)

{
  unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> uVar1;
  bool bVar2;
  int iVar3;
  MkvWriter *this;
  char *pcVar4;
  uint64_t track_number;
  VideoTrack *this_00;
  aom_fixed_buf_t *__ptr;
  ulong uVar5;
  Tag *this_01;
  double dVar6;
  size_t sStack_c0;
  unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> segment;
  uint8_t av1_config_buffer [4];
  Av1Config av1_config;
  size_t bytes_written;
  string version;
  
  this = (MkvWriter *)operator_new(0x18,(nothrow_t *)&std::nothrow);
  if (this != (MkvWriter *)0x0) {
    mkvmuxer::MkvWriter::MkvWriter(this,webm_ctx->stream);
  }
  segment._M_t.super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>.
  _M_t.super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>.
  super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl =
       (__uniq_ptr_data<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>,_true,_true>)
       operator_new(0x990,(nothrow_t *)&std::nothrow);
  if ((tuple<mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>)
      segment._M_t.super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>
      ._M_t.super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>.
      super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl ==
      (_Head_base<0UL,_mkvmuxer::Segment_*,_false>)0x0) {
    segment._M_t.super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>.
    _M_t.super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>.
    super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>,_true,_true>)
         (__uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>)0x0;
LAB_001278e3:
    pcVar4 = "webmenc> mkvmuxer objects alloc failed, out of memory?\n";
    sStack_c0 = 0x37;
  }
  else {
    mkvmuxer::Segment::Segment
              ((Segment *)
               segment._M_t.
               super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>.
               _M_t.
               super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>.
               super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl);
    if (this == (MkvWriter *)0x0) goto LAB_001278e3;
    bVar2 = mkvmuxer::Segment::Init
                      ((Segment *)
                       segment._M_t.
                       super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>
                       .super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl,
                       (IMkvWriter *)this);
    if (bVar2) {
      *(undefined4 *)
       ((long)segment._M_t.
              super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>._M_t
              .super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>.
              super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl + 0x948) = 2;
      mkvmuxer::Segment::OutputCues
                ((Segment *)
                 segment._M_t.
                 super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>
                 .super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl,true);
      uVar1 = segment;
      *(undefined8 *)
       ((long)segment._M_t.
              super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>._M_t
              .super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>.
              super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl + 0x78) = 1000000;
      std::__cxx11::string::string((string *)&version,"aomenc",(allocator *)&av1_config);
      if (webm_ctx->debug == 0) {
        std::__cxx11::string::string((string *)&bytes_written," ",(allocator *)av1_config_buffer);
        pcVar4 = aom_codec_version_str();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &av1_config,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bytes_written,pcVar4);
        std::__cxx11::string::append((string *)&version);
        std::__cxx11::string::~string((string *)&av1_config);
        std::__cxx11::string::~string((string *)&bytes_written);
      }
      mkvmuxer::SegmentInfo::set_writing_app
                ((SegmentInfo *)
                 ((long)uVar1._M_t.
                        super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>
                        .super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl + 0x68),
                 version._M_dataplus._M_p);
      track_number = mkvmuxer::Segment::AddVideoTrack
                               ((Segment *)
                                segment._M_t.
                                super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>
                                .super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl,
                                cfg->g_w,cfg->g_h,1);
      this_00 = (VideoTrack *)
                mkvmuxer::Segment::GetTrackByNumber
                          ((Segment *)
                           segment._M_t.
                           super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>
                           .super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl,
                           track_number);
      if (this_00 == (VideoTrack *)0x0) {
        pcVar4 = "webmenc> Video track creation failed.\n";
        sStack_c0 = 0x26;
        goto LAB_0012796b;
      }
      __ptr = aom_codec_get_global_headers(encoder_ctx);
      if (__ptr == (aom_fixed_buf_t *)0x0) {
LAB_001278c5:
        pcVar4 = "webmenc> Unable to set AV1 config.\n";
        sStack_c0 = 0x23;
LAB_0012796b:
        fwrite(pcVar4,sStack_c0,1,_stderr);
        iVar3 = -1;
      }
      else {
        iVar3 = get_av1config_from_obu((uint8_t *)__ptr->buf,__ptr->sz,0,&av1_config);
        if (iVar3 != 0) {
LAB_001278b4:
          free(__ptr->buf);
          free(__ptr);
          goto LAB_001278c5;
        }
        av1_config_buffer[0] = '\0';
        av1_config_buffer[1] = '\0';
        av1_config_buffer[2] = '\0';
        av1_config_buffer[3] = '\0';
        bytes_written = 0;
        iVar3 = write_av1config(&av1_config,4,&bytes_written,av1_config_buffer);
        if (iVar3 != 0) goto LAB_001278b4;
        bVar2 = mkvmuxer::Track::SetCodecPrivate((Track *)this_00,av1_config_buffer,4);
        free(__ptr->buf);
        free(__ptr);
        if (!bVar2) goto LAB_001278c5;
        bVar2 = mkvmuxer::VideoTrack::SetStereoMode(this_00,(ulong)stereo_fmt);
        if (!bVar2) {
          pcVar4 = "webmenc> Unable to set stereo mode.\n";
          sStack_c0 = 0x24;
          goto LAB_0012796b;
        }
        if (fourcc != 0x31305641) {
          pcVar4 = "webmenc> Unsupported codec (unknown 4 CC).\n";
          sStack_c0 = 0x2b;
          goto LAB_0012796b;
        }
        mkvmuxer::Track::set_codec_id((Track *)this_00,"V_AV1");
        if (1 < par->denominator || 1 < par->numerator) {
          dVar6 = (double)(par->numerator * cfg->g_w) / (double)par->denominator + 0.5;
          uVar5 = (ulong)dVar6;
          this_00->display_width_ =
               (long)(dVar6 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
          this_00->display_height_ = (ulong)cfg->g_h;
        }
        if (encoder_settings != (char *)0x0) {
          this_01 = mkvmuxer::Segment::AddTag
                              ((Segment *)
                               segment._M_t.
                               super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>
                               .super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl);
          if (this_01 != (Tag *)0x0) {
            bVar2 = mkvmuxer::Tag::add_simple_tag(this_01,"ENCODER_SETTINGS",encoder_settings);
            if (bVar2) goto LAB_00127889;
          }
          pcVar4 = "webmenc> Unable to allocate memory for encoder settings tag.\n";
          sStack_c0 = 0x3d;
          goto LAB_0012796b;
        }
LAB_00127889:
        uVar1._M_t.super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>
        ._M_t.super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>.
        super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl =
             segment._M_t.
             super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>._M_t.
             super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>.
             super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl;
        if (webm_ctx->debug != 0) {
          (this_00->super_Track).uid_ = 0xdeadbeef;
        }
        webm_ctx->writer = this;
        segment._M_t.
        super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>._M_t.
        super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>.
        super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl =
             (__uniq_ptr_data<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>,_true,_true>
             )(__uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>)0x0;
        webm_ctx->segment =
             (void *)uVar1._M_t.
                     super___uniq_ptr_impl<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_mkvmuxer::Segment_*,_std::default_delete<mkvmuxer::Segment>_>
                     .super__Head_base<0UL,_mkvmuxer::Segment_*,_false>._M_head_impl;
        this = (MkvWriter *)0x0;
        iVar3 = 0;
      }
      std::__cxx11::string::~string((string *)&version);
      goto LAB_00127981;
    }
    pcVar4 = "webmenc> mkvmuxer Init failed.\n";
    sStack_c0 = 0x1f;
  }
  fwrite(pcVar4,sStack_c0,1,_stderr);
  iVar3 = -1;
LAB_00127981:
  std::unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>::~unique_ptr(&segment)
  ;
  if (this != (MkvWriter *)0x0) {
    (*(this->super_IMkvWriter)._vptr_IMkvWriter[6])(this);
  }
  return iVar3;
}

Assistant:

int write_webm_file_header(struct WebmOutputContext *webm_ctx,
                           aom_codec_ctx_t *encoder_ctx,
                           const aom_codec_enc_cfg_t *cfg,
                           stereo_format_t stereo_fmt, unsigned int fourcc,
                           const struct AvxRational *par,
                           const char *encoder_settings) {
  std::unique_ptr<mkvmuxer::MkvWriter> writer(
      new (std::nothrow) mkvmuxer::MkvWriter(webm_ctx->stream));
  std::unique_ptr<mkvmuxer::Segment> segment(new (std::nothrow)
                                                 mkvmuxer::Segment());
  if (writer == nullptr || segment == nullptr) {
    fprintf(stderr, "webmenc> mkvmuxer objects alloc failed, out of memory?\n");
    return -1;
  }

  bool ok = segment->Init(writer.get());
  if (!ok) {
    fprintf(stderr, "webmenc> mkvmuxer Init failed.\n");
    return -1;
  }

  segment->set_mode(mkvmuxer::Segment::kFile);
  segment->OutputCues(true);

  mkvmuxer::SegmentInfo *const info = segment->GetSegmentInfo();
  if (!info) {
    fprintf(stderr, "webmenc> Cannot retrieve Segment Info.\n");
    return -1;
  }

  const uint64_t kTimecodeScale = 1000000;
  info->set_timecode_scale(kTimecodeScale);
  std::string version = "aomenc";
  if (!webm_ctx->debug) {
    version.append(std::string(" ") + aom_codec_version_str());
  }
  info->set_writing_app(version.c_str());

  const uint64_t video_track_id =
      segment->AddVideoTrack(static_cast<int>(cfg->g_w),
                             static_cast<int>(cfg->g_h), kVideoTrackNumber);
  mkvmuxer::VideoTrack *const video_track = static_cast<mkvmuxer::VideoTrack *>(
      segment->GetTrackByNumber(video_track_id));

  if (!video_track) {
    fprintf(stderr, "webmenc> Video track creation failed.\n");
    return -1;
  }

  ok = false;
  aom_fixed_buf_t *obu_sequence_header =
      aom_codec_get_global_headers(encoder_ctx);
  if (obu_sequence_header) {
    Av1Config av1_config;
    if (get_av1config_from_obu(
            reinterpret_cast<const uint8_t *>(obu_sequence_header->buf),
            obu_sequence_header->sz, false, &av1_config) == 0) {
      uint8_t av1_config_buffer[4] = { 0 };
      size_t bytes_written = 0;
      if (write_av1config(&av1_config, sizeof(av1_config_buffer),
                          &bytes_written, av1_config_buffer) == 0) {
        ok = video_track->SetCodecPrivate(av1_config_buffer,
                                          sizeof(av1_config_buffer));
      }
    }
    free(obu_sequence_header->buf);
    free(obu_sequence_header);
  }
  if (!ok) {
    fprintf(stderr, "webmenc> Unable to set AV1 config.\n");
    return -1;
  }

  ok = video_track->SetStereoMode(stereo_fmt);
  if (!ok) {
    fprintf(stderr, "webmenc> Unable to set stereo mode.\n");
    return -1;
  }

  if (fourcc != AV1_FOURCC) {
    fprintf(stderr, "webmenc> Unsupported codec (unknown 4 CC).\n");
    return -1;
  }
  video_track->set_codec_id("V_AV1");

  if (par->numerator > 1 || par->denominator > 1) {
    // TODO(fgalligan): Add support of DisplayUnit, Display Aspect Ratio type
    // to WebM format.
    const uint64_t display_width = static_cast<uint64_t>(
        ((cfg->g_w * par->numerator * 1.0) / par->denominator) + .5);
    video_track->set_display_width(display_width);
    video_track->set_display_height(cfg->g_h);
  }

  if (encoder_settings != nullptr) {
    mkvmuxer::Tag *tag = segment->AddTag();
    if (tag == nullptr) {
      fprintf(stderr,
              "webmenc> Unable to allocate memory for encoder settings tag.\n");
      return -1;
    }
    ok = tag->add_simple_tag("ENCODER_SETTINGS", encoder_settings);
    if (!ok) {
      fprintf(stderr,
              "webmenc> Unable to allocate memory for encoder settings tag.\n");
      return -1;
    }
  }

  if (webm_ctx->debug) {
    video_track->set_uid(kDebugTrackUid);
  }

  webm_ctx->writer = writer.release();
  webm_ctx->segment = segment.release();
  return 0;
}